

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O2

bool __thiscall
ON_ModelComponent::SetDeletedModelComponentState
          (ON_ModelComponent *this,bool bDeleted,ON_ComponentManifest *manifest)

{
  ON_UUID item_id;
  ON_UUID parent_id;
  bool bVar1;
  bool bVar2;
  ON_ComponentManifestItem *pOVar3;
  ON__UINT64 OVar4;
  wchar_t *pwVar5;
  char *pcVar6;
  int iVar7;
  ON_wString assigned_name;
  ON_ComponentStatus component_status;
  ON_wString candidate_name;
  
  component_status = this->m_component_status;
  bVar1 = ON_ComponentStatus::IsDeleted(&component_status);
  if (bVar1 == bDeleted) {
    pcVar6 = "model_component deleted status = bDeleted";
    iVar7 = 0x8f0;
LAB_0054690a:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,iVar7,"",pcVar6);
  }
  else {
    ON_ComponentStatus::SetDeletedState(&component_status,bDeleted);
    bVar1 = SetModelComponentStatus(this,component_status);
    if (!bVar1) {
      pcVar6 = "cannot change component deleted state.";
      iVar7 = 0x8f7;
      goto LAB_0054690a;
    }
  }
  if (manifest == (ON_ComponentManifest *)0x0) {
    pOVar3 = &ON_ComponentManifestItem::UnsetItem;
    bVar1 = false;
  }
  else {
    if ((bDeleted) || (bVar1 = ::operator==(&ON_nil_uuid,&this->m_component_id), bVar1)) {
      pOVar3 = ON_ComponentManifest::ItemFromComponentRuntimeSerialNumber
                         (manifest,this->m_runtime_serial_number);
    }
    else {
      pOVar3 = ON_ComponentManifest::ItemFromId(manifest,this->m_component_id);
    }
    _candidate_name = ON_ComponentManifestItem::Id(pOVar3);
    bVar2 = ::operator==((ON_UUID_struct *)&candidate_name,&this->m_component_id);
    if (bVar2 && bDeleted) {
      OVar4 = ON_ComponentManifestItem::ComponentRuntimeSerialNumber(pOVar3);
      bVar1 = true;
      if (OVar4 != this->m_runtime_serial_number) {
LAB_0054699a:
        bVar1 = false;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                   ,0x907,"","component is not in manifest.");
      }
    }
    else {
      bVar1 = true;
      if (!bVar2) goto LAB_0054699a;
    }
  }
  if (!bDeleted) {
    ON_wString::ON_wString(&candidate_name);
    if ((this->m_set_status & 0x20) == 0) {
      if ((char)this->m_set_status < '\0') {
        DeletedName((ON_ModelComponent *)&assigned_name);
        ON_wString::operator=(&candidate_name,&assigned_name);
        ON_wString::~ON_wString(&assigned_name);
        bVar2 = UndeleteName(this);
        if (!bVar2) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                     ,0x938,"","cannot model_component deleted name cannot be restored.");
        }
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x930,"","model_component name is already set");
      Name((ON_ModelComponent *)&assigned_name);
      ON_wString::operator=(&candidate_name,&assigned_name);
      ON_wString::~ON_wString(&assigned_name);
    }
    if (bVar1) {
      bVar1 = ON_ComponentManifestItem::IsDeleted(pOVar3);
      if (bVar1) {
        ON_wString::ON_wString(&assigned_name);
        OVar4 = this->m_runtime_serial_number;
        item_id = this->m_component_id;
        parent_id = this->m_component_parent_id;
        pwVar5 = ON_wString::operator_cast_to_wchar_t_(&candidate_name);
        pOVar3 = ON_ComponentManifest::UndeleteComponentAndChangeRuntimeSerialNumber
                           (manifest,item_id,parent_id,OVar4,pwVar5,&assigned_name);
        bVar1 = ON_ComponentManifestItem::IsDeleted(pOVar3);
        if (bVar1) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                     ,0x951,"","unable to change manifest item deleted status to false.");
        }
        pwVar5 = ON_wString::operator_cast_to_wchar_t_(&assigned_name);
        SetName(this,pwVar5);
        ON_wString::~ON_wString(&assigned_name);
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                   ,0x941,"","doc_manifest item deleted status is already false.");
      }
    }
    ON_wString::~ON_wString(&candidate_name);
    goto LAB_00546c44;
  }
  if ((char)this->m_set_status < '\0') {
    pcVar6 = "component name is already deleted";
    iVar7 = 0x90f;
LAB_00546a9a:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,iVar7,"",pcVar6);
  }
  else if (((this->m_set_status & 0x20) != 0) && (bVar2 = DeleteName(this), !bVar2)) {
    pcVar6 = "component name cannot be deleted.";
    iVar7 = 0x915;
    goto LAB_00546a9a;
  }
  if (bVar1) {
    bVar1 = ON_ComponentManifestItem::IsDeleted(pOVar3);
    if (bVar1) {
      pcVar6 = "manifest item deleted status is already true.";
      iVar7 = 0x91e;
    }
    else {
      pOVar3 = ON_ComponentManifest::DeleteComponent(manifest,this->m_runtime_serial_number);
      bVar1 = ON_ComponentManifestItem::IsDeleted(pOVar3);
      if (bVar1) goto LAB_00546c44;
      pcVar6 = "unable to change manifest item deleted status to true.";
      iVar7 = 0x925;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,iVar7,"",pcVar6);
  }
LAB_00546c44:
  bVar1 = ON_ComponentStatus::IsDeleted(&this->m_component_status);
  return bVar1 == bDeleted;
}

Assistant:

bool ON_ModelComponent::SetDeletedModelComponentState(
  bool bDeleted,
  ON_ComponentManifest* manifest
  )
{
  bDeleted = bDeleted ? true : false; // ensure exact "true"
  ON_ComponentStatus component_status = ModelComponentStatus();
  if (bDeleted == component_status.IsDeleted())
  {
    // nothing to change
    ON_ERROR("model_component deleted status = bDeleted");
  }
  else
  {
    component_status.SetDeletedState(bDeleted);
    if (false == SetModelComponentStatus(component_status))
    {
      ON_ERROR("cannot change component deleted state.");
    }
  }

  const ON_ComponentManifestItem& manifest_item
    = (nullptr != manifest)
    ? ((bDeleted || ON_nil_uuid == m_component_id) ? manifest->ItemFromComponentRuntimeSerialNumber(m_runtime_serial_number) : manifest->ItemFromId(m_component_id))
    : ON_ComponentManifestItem::UnsetItem;
  
  const bool bComponentInManifest 
    = nullptr != manifest 
    && manifest_item.Id() == m_component_id
    && (false == bDeleted || manifest_item.ComponentRuntimeSerialNumber() == this->m_runtime_serial_number);
    
  if (nullptr != manifest && false == bComponentInManifest )
  {
    ON_ERROR("component is not in manifest.");
  }

  if (bDeleted)
  {
    // delete component name
    if (DeletedNameIsSet())
    {
      ON_ERROR("component name is already deleted");
    }
    else if (NameIsSet())
    {
      if (false == DeleteName())
      {
        ON_ERROR("component name cannot be deleted.");
      }
    }

    if (bComponentInManifest)
    {
      // delete manifest item
      if (manifest_item.IsDeleted())
      {
        ON_ERROR("manifest item deleted status is already true.");
      }
      else
      {
        const ON_ComponentManifestItem& deleted_manifest_item = manifest->DeleteComponent(m_runtime_serial_number);
        if (false == deleted_manifest_item.IsDeleted())
        {
          ON_ERROR("unable to change manifest item deleted status to true.");
        }
      }
    }
  }
  else
  {
    // undelete component name
    ON_wString candidate_name;
    if (NameIsSet())
    {
      ON_ERROR("model_component name is already set");
      candidate_name = Name();
    }
    else if (DeletedNameIsSet())
    {
      candidate_name = DeletedName();
      if (false == UndeleteName())
      {
        ON_ERROR("cannot model_component deleted name cannot be restored.");
      }
    }

    if (bComponentInManifest)
    {
      // undelete manifest item
      if (false == manifest_item.IsDeleted())
      {
        ON_ERROR("doc_manifest item deleted status is already false.");
      }
      else
      {
        // When an component is being replaced, it is common for the old an new component
        // to have the same id but different RuntimeSerialNumber() values.
        ON_wString assigned_name;
        const ON_ComponentManifestItem& undeleted_manifest_item = manifest->UndeleteComponentAndChangeRuntimeSerialNumber(
          Id(),
          ParentId(),
          RuntimeSerialNumber(),
          candidate_name,
          assigned_name
          );
        if (false != undeleted_manifest_item.IsDeleted())
        {
          ON_ERROR("unable to change manifest item deleted status to false.");
        }
        SetName(assigned_name);
      }
    }
  }

  return (bDeleted == IsDeleted());
}